

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

void __thiscall
helics::CoreBroker::setGlobal(CoreBroker *this,string_view valueName,string_view value)

{
  ActionMessage querycmd;
  basic_string_view<char,_std::char_traits<char>_> local_f0;
  ActionMessage local_e0;
  
  local_f0._M_str = valueName._M_str;
  local_f0._M_len = valueName._M_len;
  ActionMessage::ActionMessage(&local_e0,cmd_set_global);
  local_e0.source_id.gid = (this->super_BrokerBase).global_id._M_i.gid;
  SmallBuffer::operator=(&local_e0.payload,&local_f0);
  ActionMessage::setStringData(&local_e0,value);
  transmitToParent(this,&local_e0);
  ActionMessage::~ActionMessage(&local_e0);
  return;
}

Assistant:

void CoreBroker::setGlobal(std::string_view valueName, std::string_view value)
{
    ActionMessage querycmd(CMD_SET_GLOBAL);
    querycmd.source_id = global_id.load();
    querycmd.payload = valueName;
    querycmd.setStringData(value);
    transmitToParent(std::move(querycmd));
}